

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

void __thiscall mognetwork::Packet::~Packet(Packet *this)

{
  ReadedDatas *this_00;
  
  this->_vptr_Packet = (_func_int **)&PTR__Packet_00114a60;
  this_00 = this->m_dataPack;
  if (this_00 == (ReadedDatas *)0x0) {
    this_00 = (ReadedDatas *)this->m_data;
    if (this_00 == (ReadedDatas *)0x0) {
      return;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)this_00);
  }
  else {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this_00->datas).super__Vector_base<char,_std::allocator<char>_>);
  }
  operator_delete(this_00);
  return;
}

Assistant:

Packet::~Packet()
  {
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
  }